

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  clock_t cVar1;
  clock_t cVar2;
  ostream *poVar3;
  long *plVar4;
  string outputFile;
  string inputFile;
  string local_58;
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"../data/test_data.txt","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"../projects/student/result.txt","");
  cVar1 = clock();
  init((EVP_PKEY_CTX *)local_38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time:",5);
  cVar2 = clock();
  poVar3 = std::ostream::_M_insert<double>((double)(cVar2 - cVar1) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  cVar1 = clock();
  run();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time:",5);
  cVar2 = clock();
  poVar3 = std::ostream::_M_insert<double>((double)(cVar2 - cVar1) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  cVar1 = clock();
  output(&local_58);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time:",5);
  cVar2 = clock();
  poVar3 = std::ostream::_M_insert<double>((double)(cVar2 - cVar1) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,ansNum);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
    string inputFile = "../data/test_data.txt";
    string outputFile = "../projects/student/result.txt";
    auto t = clock();
    init(inputFile);
    cout << "time:" << double(clock() - t) / CLOCKS_PER_SEC << "s" << endl;
    t = clock();
    run();
    cout << "time:" << double(clock() - t) / CLOCKS_PER_SEC << "s" << endl;
    t = clock();
    output(outputFile);
    cout << "time:" << double(clock() - t) / CLOCKS_PER_SEC << "s" << endl;
    cout << ansNum << endl;

    return 0;
}